

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O3

void __thiscall ThreadPool::~ThreadPool(ThreadPool *this)

{
  _List_node_base *p_Var1;
  pointer puVar2;
  _List_node_base *p_Var3;
  
  stop(this);
  p_Var3 = (this->_task).
           super__List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&this->_task) {
    p_Var1 = p_Var3->_M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var1;
  }
  std::condition_variable::~condition_variable(&this->_completeCreation);
  std::condition_variable::~condition_variable(&this->_waiting);
  puVar2 = (this->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->_worker);
  return;
}

Assistant:

ThreadPool::~ThreadPool()
{
    stop();
}